

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerSetGlobal(HelicsBroker broker,char *valueName,char *value,HelicsError *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  HelicsError *in_RCX;
  long in_RDX;
  long in_RSI;
  Broker *brk;
  HelicsError *in_stack_ffffffffffffffb0;
  __sv_type in_stack_ffffffffffffffb8;
  undefined8 local_38;
  undefined8 local_30;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getBroker((HelicsBroker)in_stack_ffffffffffffffb8._M_len,in_stack_ffffffffffffffb0);
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RCX,-4,"Global name cannot be null");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffffb8._M_str,(char *)in_stack_ffffffffffffffb8._M_len);
      if (in_RDX == 0) {
        in_stack_ffffffffffffffb8 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_ffffffffffffffb8._M_str,(char *)in_stack_ffffffffffffffb8._M_len);
      }
      (**(code **)((this->_M_dataplus)._M_p + 0x90))
                (this,local_38,local_30,in_stack_ffffffffffffffb8._M_len,
                 in_stack_ffffffffffffffb8._M_str);
    }
  }
  return;
}

Assistant:

void helicsBrokerSetGlobal(HelicsBroker broker, const char* valueName, const char* value, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    brk->setGlobal(valueName, AS_STRING_VIEW(value));
}